

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void COVER_warnOnSmallCorpus(size_t maxDictSize,size_t nbDmers,int displayLevel)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (0 < displayLevel) {
    auVar1._8_4_ = (int)(nbDmers >> 0x20);
    auVar1._0_8_ = nbDmers;
    auVar1._12_4_ = 0x45300000;
    auVar2._8_4_ = (int)(maxDictSize >> 0x20);
    auVar2._0_8_ = maxDictSize;
    auVar2._12_4_ = 0x45300000;
    if (((auVar1._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)nbDmers) - 4503599627370496.0)) /
        ((auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)maxDictSize) - 4503599627370496.0)) < 10.0) {
      fprintf(_stderr,
              "WARNING: The maximum dictionary size %u is too large compared to the source size %u! size(source)/size(dictionary) = %f, but it should be >= 10! This may lead to a subpar dictionary! We recommend training on sources at least 10x, and preferably 100x the size of the dictionary! \n"
              ,maxDictSize & 0xffffffff,nbDmers);
      fflush(_stderr);
      return;
    }
  }
  return;
}

Assistant:

void COVER_warnOnSmallCorpus(size_t maxDictSize, size_t nbDmers, int displayLevel)
{
  const double ratio = (double)nbDmers / (double)maxDictSize;
  if (ratio >= 10) {
      return;
  }
  LOCALDISPLAYLEVEL(displayLevel, 1,
                    "WARNING: The maximum dictionary size %u is too large "
                    "compared to the source size %u! "
                    "size(source)/size(dictionary) = %f, but it should be >= "
                    "10! This may lead to a subpar dictionary! We recommend "
                    "training on sources at least 10x, and preferably 100x "
                    "the size of the dictionary! \n", (U32)maxDictSize,
                    (U32)nbDmers, ratio);
}